

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEES_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::SEES_PDU::SetVectoringNozzleSystem
          (SEES_PDU *this,
          vector<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
          *VNS)

{
  size_type sVar1;
  vector<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
  *VNS_local;
  SEES_PDU *this_local;
  
  sVar1 = std::
          vector<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
          ::size(&this->m_vVecNozzleSys);
  (this->super_Header).super_Header6.m_ui16PDULength =
       (this->super_Header).super_Header6.m_ui16PDULength - (short)(sVar1 << 3);
  std::
  vector<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
  ::operator=(&this->m_vVecNozzleSys,VNS);
  sVar1 = std::
          vector<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
          ::size(&this->m_vVecNozzleSys);
  this->m_ui16NumVectoringNozzleSys = (KUINT16)sVar1;
  sVar1 = std::
          vector<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
          ::size(&this->m_vVecNozzleSys);
  (this->super_Header).super_Header6.m_ui16PDULength =
       (this->super_Header).super_Header6.m_ui16PDULength + (short)(sVar1 << 3);
  return;
}

Assistant:

void SEES_PDU::SetVectoringNozzleSystem( const vector<VectoringNozzleSystem> & VNS )
{
    m_ui16PDULength -= VectoringNozzleSystem::VECTORING_NOZZLE_SYSTEM_SIZE * m_vVecNozzleSys.size();
    m_vVecNozzleSys = VNS;
    m_ui16NumVectoringNozzleSys = m_vVecNozzleSys.size();
    m_ui16PDULength += VectoringNozzleSystem::VECTORING_NOZZLE_SYSTEM_SIZE * m_vVecNozzleSys.size();
}